

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

void flatbuffers::tests::ParseProtoTest(string *tests_data_path)

{
  bool bVar1;
  flatbuffers *pfVar2;
  string *in_RCX;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string import_proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string proto_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> proto_path;
  string *tests_data_path_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&proto_file.field_2 + 8),tests_data_path,"prototest/");
  std::__cxx11::string::string((string *)local_50);
  std::operator+(&local_70,tests_data_path,"prototest/test.proto");
  pfVar2 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar2,(char *)0x0,SUB81(local_50,0),in_RCX);
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
  ;
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"prototest/test.proto\").c_str(), false, &proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x123,"");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)local_a0);
  std::operator+(&local_c0,tests_data_path,"prototest/imported.proto");
  pfVar2 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar2,(char *)0x0,SUB81(local_a0,0),(string *)pcVar3);
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
  ;
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"prototest/imported.proto\").c_str(), false, &import_proto_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x129,"");
  std::__cxx11::string::~string((string *)&local_c0);
  proto_test((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_union((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_union_suffix((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_include((tests *)(proto_file.field_2._M_local_buf + 8),(string *)local_50,
                     (string *)local_a0,(string *)pcVar3);
  proto_test_include_union
            ((tests *)(proto_file.field_2._M_local_buf + 8),(string *)local_50,(string *)local_a0,
             (string *)pcVar3);
  proto_test_id((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_union_id((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_union_suffix_id((string *)((long)&proto_file.field_2 + 8),(string *)local_50);
  proto_test_include_id
            ((tests *)(proto_file.field_2._M_local_buf + 8),(string *)local_50,(string *)local_a0,
             (string *)pcVar3);
  proto_test_include_union_id
            ((tests *)(proto_file.field_2._M_local_buf + 8),(string *)local_50,(string *)local_a0,
             (string *)pcVar3);
  ParseCorruptedProto((string *)((long)&proto_file.field_2 + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(proto_file.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ParseProtoTest(const std::string &tests_data_path) {
  auto proto_path = tests_data_path + "prototest/";
  std::string proto_file;
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "prototest/test.proto").c_str(),
                            false, &proto_file),
      true);

  std::string import_proto_file;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "prototest/imported.proto").c_str(), false,
              &import_proto_file),
          true);

  proto_test(proto_path, proto_file);
  proto_test_union(proto_path, proto_file);
  proto_test_union_suffix(proto_path, proto_file);
  proto_test_include(proto_path, proto_file, import_proto_file);
  proto_test_include_union(proto_path, proto_file, import_proto_file);

  proto_test_id(proto_path, proto_file);
  proto_test_union_id(proto_path, proto_file);
  proto_test_union_suffix_id(proto_path, proto_file);
  proto_test_include_id(proto_path, proto_file, import_proto_file);
  proto_test_include_union_id(proto_path, proto_file, import_proto_file);

  ParseCorruptedProto(proto_path);
}